

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

bool __thiscall roaring::Roaring64Map::isEmpty(Roaring64Map *this)

{
  _Bool _Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = p_Var2;
  while (((_Rb_tree_header *)p_Var2 != p_Var3 &&
         (_Var1 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var2[1]._M_parent), p_Var4 = p_Var2
         , _Var1))) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    p_Var4 = &p_Var3->_M_header;
  }
  return (_Rb_tree_header *)p_Var4 == p_Var3;
}

Assistant:

bool isEmpty() const {
        return std::all_of(
            roarings.cbegin(), roarings.cend(),
            [](const std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.isEmpty();
            });
    }